

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::operator==
          (Electromagnetic_Emission_PDU *this,Electromagnetic_Emission_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_EmittingEntityID,&Value->m_EmittingEntityID), !KVar1)) &&
      (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1))
     && ((this->m_ui8StateUpdateIndicator == Value->m_ui8StateUpdateIndicator &&
         (this->m_ui8NumberOfEmissionSystems == Value->m_ui8NumberOfEmissionSystems)))) {
    bVar2 = std::operator!=(&this->m_vEmissionSystem,&Value->m_vEmissionSystem);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Electromagnetic_Emission_PDU::operator == ( const Electromagnetic_Emission_PDU & Value ) const
{
    if( Header::operator                !=( Value ) )                           return false;
    if( m_EmittingEntityID              != Value.m_EmittingEntityID )           return false;
    if( m_EventID                       != Value.m_EventID )                    return false;
    if( m_ui8StateUpdateIndicator       != Value.m_ui8StateUpdateIndicator )    return false;
    if( m_ui8NumberOfEmissionSystems    != Value.m_ui8NumberOfEmissionSystems ) return false;
    if( m_vEmissionSystem               != Value.m_vEmissionSystem )            return false;
    return true;
}